

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall Lexer::error<char_const(&)[30],int&>(Lexer *this,char (*args) [30],int *args_1)

{
  uint uVar1;
  undefined8 uVar2;
  TextPos *pTVar3;
  char local_1028 [8];
  char buf [4096];
  int *args_local_1;
  char (*args_local) [30];
  Lexer *this_local;
  
  sprintf(local_1028,*args,(ulong)(uint)*args_1);
  uVar2 = std::__cxx11::string::c_str();
  pTVar3 = CharReader::pos(&this->reader);
  uVar1 = pTVar3->line;
  pTVar3 = CharReader::pos(&this->reader);
  printf("%s:%d:%d: %s\n",uVar2,(ulong)uVar1,(ulong)(uint)pTVar3->col,local_1028);
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    std::printf("%s:%d:%d: %s\n",
                data.fn.c_str(),
                reader.pos().line,
                reader.pos().col,
                buf);
    std::exit(1);
  }